

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_mapper.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::FriendlyNameMapper::ParseInstruction
          (FriendlyNameMapper *this,spv_parsed_instruction_t *inst)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort uVar2;
  uint uVar3;
  uint32_t id;
  uint uVar4;
  uint32_t *puVar5;
  undefined8 *puVar6;
  long *plVar7;
  iterator iVar8;
  size_type *psVar9;
  ulong *puVar10;
  uint32_t in_EDX;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t n_02;
  char *pcVar11;
  size_type sVar12;
  char *pcVar13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  __string_type value_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  uint32_t result_id;
  ostringstream value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230;
  string local_210;
  string local_1f0;
  uint local_1cc;
  string local_1c8 [3];
  ios_base local_158 [264];
  string local_50;
  
  uVar3 = inst->result_id;
  uVar2 = inst->opcode;
  local_1cc = uVar3;
  if (0x46 < uVar2) {
    if (uVar2 < 0x147) {
      if (uVar2 == 0x47) {
        puVar5 = inst->words;
        if (puVar5[2] != 0xb) {
          return SPV_SUCCESS;
        }
        if (3 < inst->num_words) {
          SaveBuiltInName(this,puVar5[1],puVar5[3]);
          return SPV_SUCCESS;
        }
        __assert_fail("inst.num_words > 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/name_mapper.cpp"
                      ,0xaf,
                      "spv_result_t spvtools::FriendlyNameMapper::ParseInstruction(const spv_parsed_instruction_t &)"
                     );
      }
      if (uVar2 != 0x142) goto switchD_001b7570_caseD_6;
      pcVar13 = "PipeStorage";
      pcVar11 = "";
      goto LAB_001b82ed;
    }
    if (uVar2 == 0x147) {
      pcVar13 = "NamedBarrier";
      pcVar11 = "";
      goto LAB_001b82ed;
    }
    if (uVar2 != 0x1141) goto switchD_001b7570_caseD_6;
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"_ptr_","");
    NameForEnumOperand_abi_cxx11_(&local_230,this,SPV_OPERAND_TYPE_STORAGE_CLASS,inst->words[2]);
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar14 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_230._M_string_length + local_250._M_string_length) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        uVar14 = local_230.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_230._M_string_length + local_250._M_string_length)
      goto LAB_001b768a;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_230,0,(char *)0x0,(ulong)local_250._M_dataplus._M_p);
    }
    else {
LAB_001b768a:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_230._M_dataplus._M_p)
      ;
    }
    local_1c8[0]._M_dataplus._M_p = (pointer)&local_1c8[0].field_2;
    puVar10 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_1c8[0].field_2._0_8_ = *puVar10;
      local_1c8[0].field_2._8_8_ = puVar6[3];
    }
    else {
      local_1c8[0].field_2._0_8_ = *puVar10;
      local_1c8[0]._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_1c8[0]._M_string_length = puVar6[1];
    *puVar6 = puVar10;
    puVar6[1] = 0;
    *(undefined1 *)puVar10 = 0;
    SaveName(this,uVar3,local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
      operator_delete(local_1c8[0]._M_dataplus._M_p,local_1c8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) goto LAB_001b7d95;
    goto LAB_001b7da2;
  }
  switch(uVar2) {
  case 5:
    id = inst->words[1];
    spvDecodeLiteralStringOperand_abi_cxx11_(local_1c8,inst,1);
    SaveName(this,id,local_1c8);
    goto LAB_001b75a0;
  default:
switchD_001b7570_caseD_6:
    if (uVar3 == 0) {
      return SPV_SUCCESS;
    }
    iVar8 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)this,&local_1cc);
    uVar3 = local_1cc;
    if (iVar8.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      return SPV_SUCCESS;
    }
    to_string_abi_cxx11_(local_1c8,(spvtools *)(ulong)local_1cc,n_01);
    SaveName(this,uVar3,local_1c8);
LAB_001b75a0:
    local_210.field_2._M_allocated_capacity = local_1c8[0].field_2._M_allocated_capacity;
    _Var15._M_p = local_1c8[0]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8[0]._M_dataplus._M_p == &local_1c8[0].field_2) {
      return SPV_SUCCESS;
    }
    goto LAB_001b8662;
  case 0x13:
    pcVar13 = "void";
    pcVar11 = "";
    break;
  case 0x14:
    pcVar13 = "bool";
    pcVar11 = "";
    break;
  case 0x15:
    paVar1 = &local_1c8[0].field_2;
    local_1c8[0]._M_string_length = 0;
    local_1c8[0].field_2._M_allocated_capacity =
         local_1c8[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
    paVar16 = &local_250.field_2;
    local_250._M_string_length = 0;
    local_250.field_2._M_allocated_capacity =
         local_250.field_2._M_allocated_capacity & 0xffffffffffffff00;
    uVar4 = inst->words[2];
    local_250._M_dataplus._M_p = (pointer)paVar16;
    local_1c8[0]._M_dataplus._M_p = (pointer)paVar1;
    switch(uVar4 << 0x1d | uVar4 - 8 >> 3) {
    case 0:
      pcVar11 = "char";
      break;
    case 1:
      pcVar11 = "short";
      break;
    default:
      to_string_abi_cxx11_(&local_230,(spvtools *)(ulong)uVar4,in_EDX);
      std::__cxx11::string::operator=((string *)&local_250,(string *)&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      pcVar11 = "i";
      this_00 = local_1c8;
      goto LAB_001b8745;
    case 3:
      pcVar11 = "int";
      break;
    case 7:
      pcVar11 = "long";
    }
    this_00 = &local_250;
LAB_001b8745:
    std::__cxx11::string::operator=((string *)this_00,pcVar11);
    if (inst->words[3] == 0) {
      std::__cxx11::string::operator=((string *)local_1c8,"u");
    }
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,local_1c8[0]._M_dataplus._M_p,
               local_1c8[0]._M_dataplus._M_p + local_1c8[0]._M_string_length);
    std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_250._M_dataplus._M_p);
    SaveName(this,uVar3,&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar16) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    local_210.field_2._M_allocated_capacity = local_1c8[0].field_2._M_allocated_capacity;
    _Var15._M_p = local_1c8[0]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8[0]._M_dataplus._M_p == paVar1) {
      return SPV_SUCCESS;
    }
    goto LAB_001b8662;
  case 0x16:
    uVar4 = inst->words[2];
    if (uVar4 == 0x40) {
      pcVar13 = "double";
      pcVar11 = "";
    }
    else {
      if (uVar4 != 0x20) {
        if (uVar4 == 0x10) {
          pcVar13 = "half";
          pcVar11 = "";
          break;
        }
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"fp","");
        to_string_abi_cxx11_(&local_230,(spvtools *)(ulong)uVar4,n_02);
        std::operator+(local_1c8,&local_250,&local_230);
        SaveName(this,uVar3,local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
          operator_delete(local_1c8[0]._M_dataplus._M_p,
                          local_1c8[0].field_2._M_allocated_capacity + 1);
        }
        local_210.field_2._M_allocated_capacity = local_230.field_2._M_allocated_capacity;
        _Var15._M_p = local_230._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) goto LAB_001b864b;
        goto LAB_001b8653;
      }
      pcVar13 = "float";
      pcVar11 = "";
    }
    break;
  case 0x17:
    pcVar13 = "v";
    pcVar11 = "";
    goto LAB_001b7ab3;
  case 0x18:
    pcVar13 = "mat";
    pcVar11 = "";
LAB_001b7ab3:
    paVar16 = &local_230.field_2;
    local_230._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,pcVar13,pcVar11);
    to_string_abi_cxx11_(&local_210,(spvtools *)(ulong)inst->words[3],n);
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar16) {
      uVar14 = local_230.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_210._M_string_length + local_230._M_string_length) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        uVar14 = local_210.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_210._M_string_length + local_230._M_string_length)
      goto LAB_001b7b19;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_210,0,(char *)0x0,(ulong)local_230._M_dataplus._M_p);
    }
    else {
LAB_001b7b19:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_210._M_dataplus._M_p)
      ;
    }
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    puVar10 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_250.field_2._M_allocated_capacity = *puVar10;
      local_250.field_2._8_8_ = puVar6[3];
    }
    else {
      local_250.field_2._M_allocated_capacity = *puVar10;
      local_250._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_250._M_string_length = puVar6[1];
    *puVar6 = puVar10;
    puVar6[1] = 0;
    *(undefined1 *)puVar10 = 0;
    NameForId_abi_cxx11_(&local_1f0,this,inst->words[2]);
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar14 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_1f0._M_string_length + local_250._M_string_length) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        uVar14 = local_1f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_1f0._M_string_length + local_250._M_string_length)
      goto LAB_001b7e67;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_1f0,0,(char *)0x0,(ulong)local_250._M_dataplus._M_p);
    }
    else {
LAB_001b7e67:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_1f0._M_dataplus._M_p)
      ;
    }
    local_1c8[0]._M_dataplus._M_p = (pointer)&local_1c8[0].field_2;
    puVar10 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_1c8[0].field_2._0_8_ = *puVar10;
      local_1c8[0].field_2._8_8_ = puVar6[3];
    }
    else {
      local_1c8[0].field_2._0_8_ = *puVar10;
      local_1c8[0]._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_1c8[0]._M_string_length = puVar6[1];
    *puVar6 = puVar10;
    puVar6[1] = 0;
    *(undefined1 *)puVar10 = 0;
    SaveName(this,uVar3,local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
      operator_delete(local_1c8[0]._M_dataplus._M_p,local_1c8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    local_210.field_2._M_allocated_capacity = local_230.field_2._M_allocated_capacity;
    _Var15._M_p = local_230._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p == paVar16) {
      return SPV_SUCCESS;
    }
    goto LAB_001b8662;
  case 0x1c:
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"_arr_","");
    NameForId_abi_cxx11_(&local_1f0,this,inst->words[2]);
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      uVar14 = local_210.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_1f0._M_string_length + local_210._M_string_length) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        uVar14 = local_1f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_1f0._M_string_length + local_210._M_string_length)
      goto LAB_001b79d1;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_1f0,0,(char *)0x0,(ulong)local_210._M_dataplus._M_p);
    }
    else {
LAB_001b79d1:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_1f0._M_dataplus._M_p)
      ;
    }
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    puVar10 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_230.field_2._M_allocated_capacity = *puVar10;
      local_230.field_2._8_8_ = puVar6[3];
    }
    else {
      local_230.field_2._M_allocated_capacity = *puVar10;
      local_230._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_230._M_string_length = puVar6[1];
    *puVar6 = puVar10;
    puVar6[1] = 0;
    *(undefined1 *)puVar10 = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_230);
    puVar10 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_250.field_2._M_allocated_capacity = *puVar10;
      local_250.field_2._8_8_ = puVar6[3];
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    }
    else {
      local_250.field_2._M_allocated_capacity = *puVar10;
      local_250._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_250._M_string_length = puVar6[1];
    *puVar6 = puVar10;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    NameForId_abi_cxx11_(&local_50,this,inst->words[3]);
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar14 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_50._M_string_length + local_250._M_string_length) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        uVar14 = local_50.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_50._M_string_length + local_250._M_string_length) goto LAB_001b84c8;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_50,0,(char *)0x0,(ulong)local_250._M_dataplus._M_p);
    }
    else {
LAB_001b84c8:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_50._M_dataplus._M_p);
    }
    local_1c8[0]._M_dataplus._M_p = (pointer)&local_1c8[0].field_2;
    puVar10 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_1c8[0].field_2._0_8_ = *puVar10;
      local_1c8[0].field_2._8_8_ = puVar6[3];
    }
    else {
      local_1c8[0].field_2._0_8_ = *puVar10;
      local_1c8[0]._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_1c8[0]._M_string_length = puVar6[1];
    *puVar6 = puVar10;
    puVar6[1] = 0;
    *(undefined1 *)puVar10 = 0;
    SaveName(this,uVar3,local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
      operator_delete(local_1c8[0]._M_dataplus._M_p,local_1c8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_001b8242:
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    goto LAB_001b8252;
  case 0x1d:
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"_runtimearr_","");
    NameForId_abi_cxx11_(&local_230,this,inst->words[2]);
    goto LAB_001b7c0e;
  case 0x1e:
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"_struct_","");
    to_string_abi_cxx11_(&local_230,(spvtools *)(ulong)uVar3,n_00);
    goto LAB_001b7c0e;
  case 0x1f:
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Opaque_","");
    spvDecodeLiteralStringOperand_abi_cxx11_(&local_210,inst,1);
    Sanitize(&local_230,(FriendlyNameMapper *)inst,&local_210);
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar14 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_230._M_string_length + local_250._M_string_length) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        uVar14 = local_230.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_230._M_string_length + local_250._M_string_length)
      goto LAB_001b7a8d;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_230,0,(char *)0x0,(ulong)local_250._M_dataplus._M_p);
    }
    else {
LAB_001b7a8d:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_230._M_dataplus._M_p)
      ;
    }
    local_1c8[0]._M_dataplus._M_p = (pointer)&local_1c8[0].field_2;
    puVar10 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_1c8[0].field_2._0_8_ = *puVar10;
      local_1c8[0].field_2._8_8_ = puVar6[3];
    }
    else {
      local_1c8[0].field_2._0_8_ = *puVar10;
      local_1c8[0]._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_1c8[0]._M_string_length = puVar6[1];
    *puVar6 = puVar10;
    puVar6[1] = 0;
    *(undefined1 *)puVar10 = 0;
    SaveName(this,uVar3,local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
      operator_delete(local_1c8[0]._M_dataplus._M_p,local_1c8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    _Var15._M_p = local_210._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
LAB_001b864b:
      operator_delete(_Var15._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
LAB_001b8653:
    local_210.field_2._M_allocated_capacity = local_250.field_2._M_allocated_capacity;
    _Var15._M_p = local_250._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p == &local_250.field_2) {
      return SPV_SUCCESS;
    }
    goto LAB_001b8662;
  case 0x20:
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"_ptr_","");
    NameForEnumOperand_abi_cxx11_(&local_1f0,this,SPV_OPERAND_TYPE_STORAGE_CLASS,inst->words[2]);
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      uVar14 = local_210.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_1f0._M_string_length + local_210._M_string_length) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        uVar14 = local_1f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_1f0._M_string_length + local_210._M_string_length)
      goto LAB_001b7847;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_1f0,0,(char *)0x0,(ulong)local_210._M_dataplus._M_p);
    }
    else {
LAB_001b7847:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_1f0._M_dataplus._M_p)
      ;
    }
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    puVar10 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_230.field_2._M_allocated_capacity = *puVar10;
      local_230.field_2._8_8_ = puVar6[3];
    }
    else {
      local_230.field_2._M_allocated_capacity = *puVar10;
      local_230._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_230._M_string_length = puVar6[1];
    *puVar6 = puVar10;
    puVar6[1] = 0;
    *(undefined1 *)puVar10 = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_230);
    puVar10 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_250.field_2._M_allocated_capacity = *puVar10;
      local_250.field_2._8_8_ = puVar6[3];
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    }
    else {
      local_250.field_2._M_allocated_capacity = *puVar10;
      local_250._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_250._M_string_length = puVar6[1];
    *puVar6 = puVar10;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    NameForId_abi_cxx11_(&local_50,this,inst->words[3]);
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar14 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_50._M_string_length + local_250._M_string_length) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        uVar14 = local_50.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_50._M_string_length + local_250._M_string_length) goto LAB_001b8190;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_50,0,(char *)0x0,(ulong)local_250._M_dataplus._M_p);
    }
    else {
LAB_001b8190:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_50._M_dataplus._M_p);
    }
    local_1c8[0]._M_dataplus._M_p = (pointer)&local_1c8[0].field_2;
    puVar10 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_1c8[0].field_2._0_8_ = *puVar10;
      local_1c8[0].field_2._8_8_ = puVar6[3];
    }
    else {
      local_1c8[0].field_2._0_8_ = *puVar10;
      local_1c8[0]._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_1c8[0]._M_string_length = puVar6[1];
    *puVar6 = puVar10;
    puVar6[1] = 0;
    *(undefined1 *)puVar10 = 0;
    SaveName(this,uVar3,local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
      operator_delete(local_1c8[0]._M_dataplus._M_p,local_1c8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_001b8242;
LAB_001b8252:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    _Var15._M_p = local_210._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p == &local_210.field_2) {
      return SPV_SUCCESS;
    }
    goto LAB_001b8662;
  case 0x22:
    pcVar13 = "Event";
    pcVar11 = "";
    break;
  case 0x23:
    pcVar13 = "DeviceEvent";
    pcVar11 = "";
    break;
  case 0x24:
    pcVar13 = "ReserveId";
    pcVar11 = "";
    break;
  case 0x25:
    pcVar13 = "Queue";
    pcVar11 = "";
    break;
  case 0x26:
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Pipe","");
    NameForEnumOperand_abi_cxx11_(&local_230,this,SPV_OPERAND_TYPE_ACCESS_QUALIFIER,inst->words[2]);
LAB_001b7c0e:
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar14 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_230._M_string_length + local_250._M_string_length) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        uVar14 = local_230.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_230._M_string_length + local_250._M_string_length)
      goto LAB_001b7c48;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_230,0,(char *)0x0,(ulong)local_250._M_dataplus._M_p);
    }
    else {
LAB_001b7c48:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_230._M_dataplus._M_p)
      ;
    }
    local_1c8[0]._M_dataplus._M_p = (pointer)&local_1c8[0].field_2;
    puVar10 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_1c8[0].field_2._0_8_ = *puVar10;
      local_1c8[0].field_2._8_8_ = puVar6[3];
    }
    else {
      local_1c8[0].field_2._0_8_ = *puVar10;
      local_1c8[0]._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_1c8[0]._M_string_length = puVar6[1];
    *puVar6 = puVar10;
    puVar6[1] = 0;
    *(undefined1 *)puVar10 = 0;
    SaveName(this,uVar3,local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
      operator_delete(local_1c8[0]._M_dataplus._M_p,local_1c8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
LAB_001b7d95:
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
LAB_001b7da2:
    local_210.field_2._M_allocated_capacity = local_250.field_2._M_allocated_capacity;
    _Var15._M_p = local_250._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p == &local_250.field_2) {
      return SPV_SUCCESS;
    }
    goto LAB_001b8662;
  case 0x29:
    pcVar13 = "true";
    pcVar11 = "";
    break;
  case 0x2a:
    pcVar13 = "false";
    pcVar11 = "";
    break;
  case 0x2b:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    EmitNumericLiteral((ostream *)local_1c8,inst,inst->operands + 2);
    std::__cxx11::stringbuf::str();
    if (local_250._M_string_length != 0) {
      sVar12 = 0;
      do {
        if (local_250._M_dataplus._M_p[sVar12] == '-') {
          local_250._M_dataplus._M_p[sVar12] = 'n';
        }
        sVar12 = sVar12 + 1;
      } while (local_250._M_string_length != sVar12);
    }
    NameForId_abi_cxx11_(&local_1f0,this,inst->type_id);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f0);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_210.field_2._M_allocated_capacity = *psVar9;
      local_210.field_2._8_8_ = plVar7[3];
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar9;
      local_210._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_210._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_210,(ulong)local_250._M_dataplus._M_p);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_230.field_2._M_allocated_capacity = *psVar9;
      local_230.field_2._8_8_ = plVar7[3];
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    }
    else {
      local_230.field_2._M_allocated_capacity = *psVar9;
      local_230._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_230._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    SaveName(this,uVar3,&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
    return SPV_SUCCESS;
  }
LAB_001b82ed:
  local_1c8[0]._M_dataplus._M_p = (pointer)&local_1c8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,pcVar13,pcVar11);
  SaveName(this,uVar3,local_1c8);
  local_210.field_2._M_allocated_capacity = local_1c8[0].field_2._M_allocated_capacity;
  _Var15._M_p = local_1c8[0]._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
LAB_001b8662:
    operator_delete(_Var15._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t FriendlyNameMapper::ParseInstruction(
    const spv_parsed_instruction_t& inst) {
  const auto result_id = inst.result_id;
  switch (spv::Op(inst.opcode)) {
    case spv::Op::OpName:
      SaveName(inst.words[1], spvDecodeLiteralStringOperand(inst, 1));
      break;
    case spv::Op::OpDecorate:
      // Decorations come after OpName.  So OpName will take precedence over
      // decorations.
      //
      // In theory, we should also handle OpGroupDecorate.  But that's unlikely
      // to occur.
      if (spv::Decoration(inst.words[2]) == spv::Decoration::BuiltIn) {
        assert(inst.num_words > 3);
        SaveBuiltInName(inst.words[1], inst.words[3]);
      }
      break;
    case spv::Op::OpTypeVoid:
      SaveName(result_id, "void");
      break;
    case spv::Op::OpTypeBool:
      SaveName(result_id, "bool");
      break;
    case spv::Op::OpTypeInt: {
      std::string signedness;
      std::string root;
      const auto bit_width = inst.words[2];
      switch (bit_width) {
        case 8:
          root = "char";
          break;
        case 16:
          root = "short";
          break;
        case 32:
          root = "int";
          break;
        case 64:
          root = "long";
          break;
        default:
          root = to_string(bit_width);
          signedness = "i";
          break;
      }
      if (0 == inst.words[3]) signedness = "u";
      SaveName(result_id, signedness + root);
    } break;
    case spv::Op::OpTypeFloat: {
      const auto bit_width = inst.words[2];
      // TODO: Handle optional fpencoding enum once actually used.
      switch (bit_width) {
        case 16:
          SaveName(result_id, "half");
          break;
        case 32:
          SaveName(result_id, "float");
          break;
        case 64:
          SaveName(result_id, "double");
          break;
        default:
          SaveName(result_id, std::string("fp") + to_string(bit_width));
          break;
      }
    } break;
    case spv::Op::OpTypeVector:
      SaveName(result_id, std::string("v") + to_string(inst.words[3]) +
                              NameForId(inst.words[2]));
      break;
    case spv::Op::OpTypeMatrix:
      SaveName(result_id, std::string("mat") + to_string(inst.words[3]) +
                              NameForId(inst.words[2]));
      break;
    case spv::Op::OpTypeArray:
      SaveName(result_id, std::string("_arr_") + NameForId(inst.words[2]) +
                              "_" + NameForId(inst.words[3]));
      break;
    case spv::Op::OpTypeRuntimeArray:
      SaveName(result_id,
               std::string("_runtimearr_") + NameForId(inst.words[2]));
      break;
    case spv::Op::OpTypePointer:
      SaveName(result_id, std::string("_ptr_") +
                              NameForEnumOperand(SPV_OPERAND_TYPE_STORAGE_CLASS,
                                                 inst.words[2]) +
                              "_" + NameForId(inst.words[3]));
      break;
    case spv::Op::OpTypeUntypedPointerKHR:
      SaveName(result_id, std::string("_ptr_") +
                              NameForEnumOperand(SPV_OPERAND_TYPE_STORAGE_CLASS,
                                                 inst.words[2]));
      break;
    case spv::Op::OpTypePipe:
      SaveName(result_id,
               std::string("Pipe") +
                   NameForEnumOperand(SPV_OPERAND_TYPE_ACCESS_QUALIFIER,
                                      inst.words[2]));
      break;
    case spv::Op::OpTypeEvent:
      SaveName(result_id, "Event");
      break;
    case spv::Op::OpTypeDeviceEvent:
      SaveName(result_id, "DeviceEvent");
      break;
    case spv::Op::OpTypeReserveId:
      SaveName(result_id, "ReserveId");
      break;
    case spv::Op::OpTypeQueue:
      SaveName(result_id, "Queue");
      break;
    case spv::Op::OpTypeOpaque:
      SaveName(result_id, std::string("Opaque_") +
                              Sanitize(spvDecodeLiteralStringOperand(inst, 1)));
      break;
    case spv::Op::OpTypePipeStorage:
      SaveName(result_id, "PipeStorage");
      break;
    case spv::Op::OpTypeNamedBarrier:
      SaveName(result_id, "NamedBarrier");
      break;
    case spv::Op::OpTypeStruct:
      // Structs are mapped rather simplisitically. Just indicate that they
      // are a struct and then give the raw Id number.
      SaveName(result_id, std::string("_struct_") + to_string(result_id));
      break;
    case spv::Op::OpConstantTrue:
      SaveName(result_id, "true");
      break;
    case spv::Op::OpConstantFalse:
      SaveName(result_id, "false");
      break;
    case spv::Op::OpConstant: {
      std::ostringstream value;
      EmitNumericLiteral(&value, inst, inst.operands[2]);
      auto value_str = value.str();
      // Use 'n' to signify negative. Other invalid characters will be mapped
      // to underscore.
      for (auto& c : value_str)
        if (c == '-') c = 'n';
      SaveName(result_id, NameForId(inst.type_id) + "_" + value_str);
    } break;
    default:
      // If this instruction otherwise defines an Id, then save a mapping for
      // it.  This is needed to ensure uniqueness in there is an OpName with
      // string something like "1" that might collide with this result_id.
      // We should only do this if a name hasn't already been registered by some
      // previous forward reference.
      if (result_id && name_for_id_.find(result_id) == name_for_id_.end())
        SaveName(result_id, to_string(result_id));
      break;
  }
  return SPV_SUCCESS;
}